

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processInitRequest(CommonCore *this,ActionMessage *cmd)

{
  uint uVar1;
  BaseTimeCoordinator *pBVar2;
  FedInfo *pFVar3;
  bool bVar4;
  FederateStates FVar5;
  int iVar6;
  FederateState *pFVar7;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_78;
  iterator local_60;
  iterator local_48;
  
  if (cmd->messageAction == cmd_init_grant) {
    if ((cmd->flags & 1) == 0) {
      bVar4 = BrokerBase::transitionBrokerState(&this->super_BrokerBase,INITIALIZING,OPERATING);
      if (bVar4) {
        if (this->filterFed != (FilterFederate *)0x0) {
          FilterFederate::organizeFilterOperations(this->filterFed);
        }
        gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
        begin(&local_48,&(this->loopFederates).dataStorage);
        gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
        end(&local_60,&(this->loopFederates).dataStorage);
        local_78.vec = local_48.vec;
        local_78.ptr = local_48.ptr;
        local_78.offset = local_48.offset;
        local_78._20_4_ = local_48._20_4_;
        while ((local_78.offset != local_60.offset || (local_78.vec != local_60.vec))) {
          FederateState::addAction((local_78.ptr)->fed,cmd);
          gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator++
                    (&local_78);
        }
        if ((this->filterFed != (FilterFederate *)0x0) &&
           ((this->filterTiming != false || ((this->super_BrokerBase).globalTime == true)))) {
          FilterFederate::handleMessage(this->filterFed,cmd);
        }
        if (this->translatorFed != (TranslatorFederate *)0x0) {
          TranslatorFederate::handleMessage(this->translatorFed,cmd);
        }
        pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar2->_vptr_BaseTimeCoordinator[10])(pBVar2,0);
        pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        iVar6 = (*pBVar2->_vptr_BaseTimeCoordinator[9])(pBVar2,0x8831d580);
        if ((char)iVar6 == '\0') {
          (this->super_BrokerBase).enteredExecutionMode = true;
        }
        bVar4 = BaseTimeCoordinator::hasActiveTimeDependencies
                          ((this->super_BrokerBase).timeCoord._M_t.
                           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl
                          );
        if (!bVar4) {
          BaseTimeCoordinator::disconnect
                    ((this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
        }
      }
      else if ((cmd->flags & 0x300) != 0) {
        gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
        begin(&local_48,&(this->loopFederates).dataStorage);
        gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
        end(&local_60,&(this->loopFederates).dataStorage);
        local_78.vec = local_48.vec;
        local_78.ptr = local_48.ptr;
        local_78.offset = local_48.offset;
        local_78._20_4_ = local_48._20_4_;
        while ((pFVar3 = local_78.ptr, local_78.offset != local_60.offset ||
               (local_78.vec != local_60.vec))) {
          FVar5 = FederateState::getState((local_78.ptr)->fed);
          if (FVar5 == CREATED) {
            FederateState::addAction(pFVar3->fed,cmd);
          }
          gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator++
                    (&local_78);
        }
      }
    }
    else if (((this->initIterations)._M_base._M_i & 1U) != 0) {
      LOCK();
      (this->initIterations)._M_base._M_i = false;
      UNLOCK();
      bVar4 = BrokerBase::transitionBrokerState(&this->super_BrokerBase,INITIALIZING,CONNECTED);
      if (bVar4) {
        gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
        begin(&local_48,&(this->loopFederates).dataStorage);
        gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
        end(&local_60,&(this->loopFederates).dataStorage);
        local_78.vec = local_48.vec;
        local_78.ptr = local_48.ptr;
        local_78.offset = local_48.offset;
        local_78._20_4_ = local_48._20_4_;
        while ((local_78.offset != local_60.offset || (local_78.vec != local_60.vec))) {
          if ((((local_78.ptr)->fed->initIterating)._M_base._M_i & 1U) != 0) {
            LOCK();
            ((local_78.ptr)->fed->initIterating)._M_base._M_i = false;
            UNLOCK();
            LOCK();
            ((local_78.ptr)->fed->init_transmitted)._M_base._M_i = false;
            UNLOCK();
            FederateState::addAction((local_78.ptr)->fed,cmd);
          }
          gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator++
                    (&local_78);
        }
      }
      else if ((cmd->flags & 0x300) != 0) {
        routeMessage(this,cmd);
        return;
      }
    }
  }
  else if ((cmd->messageAction == cmd_init) &&
          (pFVar7 = getFederateCore(this,(GlobalFederateId)(cmd->source_id).gid),
          pFVar7 != (FederateState *)0x0)) {
    LOCK();
    (pFVar7->init_transmitted)._M_base._M_i = true;
    UNLOCK();
    bVar4 = allInitReady(this);
    if (bVar4) {
      bVar4 = BrokerBase::transitionBrokerState(&this->super_BrokerBase,CONNECTED,INITIALIZING);
      if (bVar4) {
        if (((this->initIterations)._M_base._M_i & 1U) == 0) {
          checkDependencies(this);
        }
        else {
          *(byte *)&cmd->flags = (byte)cmd->flags | 1;
        }
      }
      else {
        uVar1._0_1_ = (this->super_BrokerBase).observer;
        uVar1._1_1_ = (this->super_BrokerBase).globalTime;
        uVar1._2_1_ = (this->super_BrokerBase).asyncTime;
        uVar1._3_1_ = (this->super_BrokerBase).dynamicFederation;
        if (((cmd->flags >> (uVar1 & 0x1f) & 1) == 0) &&
           ((this->super_BrokerBase).dynamicFederation != true)) {
          return;
        }
      }
      (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Core)._vptr_Core[0x6b])(this,0,cmd);
      return;
    }
  }
  return;
}

Assistant:

void CommonCore::processInitRequest(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_INIT: {
            auto* fed = getFederateCore(cmd.source_id);
            if (fed == nullptr) {
                break;
            }

            fed->init_transmitted = true;

            if (allInitReady()) {
                if (transitionBrokerState(BrokerState::CONNECTED,
                                          BrokerState::INITIALIZING)) {  // make sure we only
                    // do this once
                    if (initIterations) {
                        setActionFlag(cmd, iteration_requested_flag);
                    } else {
                        checkDependencies();
                    }
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, cmd);
                } else if (checkActionFlag(cmd, observer) || dynamicFederation) {
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, cmd);
                }
            }

        } break;
        case CMD_INIT_GRANT:
            if (checkActionFlag(cmd, iteration_requested_flag)) {
                if (initIterations) {
                    initIterations.store(false);
                    if (transitionBrokerState(BrokerState::INITIALIZING, BrokerState::CONNECTED)) {
                        loopFederates.apply([&cmd](auto& fed) {
                            if (fed->initIterating.load()) {
                                fed->initIterating.store(false);
                                fed->init_transmitted = false;
                                fed->addAction(cmd);
                            }
                        });
                    } else if (checkActionFlag(cmd, observer_flag) ||
                               checkActionFlag(cmd, dynamic_join_flag)) {
                        routeMessage(cmd);
                    }
                }
            } else {
                if (transitionBrokerState(
                        BrokerState::INITIALIZING,
                        BrokerState::OPERATING)) {  // forward the grant to all federates
                    if (filterFed != nullptr) {
                        filterFed->organizeFilterOperations();
                    }

                    loopFederates.apply([&cmd](auto& fed) { fed->addAction(cmd); });
                    if (filterFed != nullptr && (filterTiming || globalTime)) {
                        filterFed->handleMessage(cmd);
                    }
                    if (translatorFed != nullptr) {
                        translatorFed->handleMessage(cmd);
                    }
                    timeCoord->enteringExecMode();
                    auto res = timeCoord->checkExecEntry();
                    if (res == MessageProcessingResult::NEXT_STEP) {
                        enteredExecutionMode = true;
                    }
                    if (!timeCoord->hasActiveTimeDependencies()) {
                        timeCoord->disconnect();
                    }
                } else if (checkActionFlag(cmd, observer_flag) ||
                           checkActionFlag(cmd, dynamic_join_flag)) {
                    loopFederates.apply([&cmd](auto& fed) {
                        if (fed->getState() == FederateStates::CREATED) {
                            fed->addAction(cmd);
                        }
                    });
                }
            }

            break;
        default:
            break;
    }
}